

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

string * __thiscall
cppcms::http::request::http_accept_abi_cxx11_(string *__return_storage_ptr__,request *this)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  
  pcVar1 = cppcms::impl::string_map::get(&this->conn_->env_,"HTTP_ACCEPT");
  __s = "";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string request::http_accept() { return conn_->getenv("HTTP_ACCEPT"); }